

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBucket.h
# Opt level: O2

void __thiscall
CTSL::
HashBucket<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
clear(HashBucket<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      *this)

{
  HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *pHVar1;
  HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_00;
  unique_lock<std::shared_timed_mutex> lock;
  
  std::unique_lock<std::shared_timed_mutex>::unique_lock(&lock,&this->mutex_);
  this_00 = this->head;
  while (this_00 !=
         (HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)0x0) {
    pHVar1 = this_00->next;
    HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
    ~HashNode(this_00);
    operator_delete(this_00,0x30);
    this_00 = pHVar1;
  }
  this->head = (HashNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)0x0;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void clear()
  {
    // Exclusive lock to enable single write in the bucket
    std::unique_lock lock(mutex_);
    HashNode<K, V> *prev = nullptr;
    HashNode<K, V> *node = head;
    while (node != nullptr)
    {
      prev = node;
      node = node->next;
      delete prev;
    }
    head = nullptr;
  }